

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_stdcxx.h
# Opt level: O0

bool leveldb::port::Snappy_GetUncompressedLength(char *input,size_t length,size_t *result)

{
  size_t *result_local;
  size_t length_local;
  char *input_local;
  
  return false;
}

Assistant:

inline bool Snappy_GetUncompressedLength(const char* input, size_t length,
                                         size_t* result) {
#if HAVE_SNAPPY
  return snappy::GetUncompressedLength(input, length, result);
#else
  // Silence compiler warnings about unused arguments.
  (void)input;
  (void)length;
  (void)result;
  return false;
#endif  // HAVE_SNAPPY
}